

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

void __thiscall
kj::HashIndex<kj::_::(anonymous_namespace)::IntHasher>::~HashIndex
          (HashIndex<kj::_::(anonymous_namespace)::IntHasher> *this)

{
  HashIndex<kj::_::(anonymous_namespace)::IntHasher> *this_local;
  
  Array<kj::_::HashBucket>::~Array(&this->buckets);
  return;
}

Assistant:

HashIndex() = default;